

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.hh
# Opt level: O3

GeomPrimvar * __thiscall tinyusdz::GeomPrimvar::operator=(GeomPrimvar *this,GeomPrimvar *rhs)

{
  bool bVar1;
  
  ::std::__cxx11::string::_M_assign((string *)this);
  ::std::__cxx11::string::_M_assign((string *)&this->_attr);
  (this->_attr)._varying_authored = (rhs->_attr)._varying_authored;
  (this->_attr)._variability = (rhs->_attr)._variability;
  ::std::__cxx11::string::_M_assign((string *)&(this->_attr)._type_name);
  linb::any::operator=((any *)&(this->_attr)._var,(any *)&(rhs->_attr)._var);
  (this->_attr)._var._blocked = (rhs->_attr)._var._blocked;
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::operator=(&(this->_attr)._var._ts._samples,&(rhs->_attr)._var._ts._samples);
  (this->_attr)._var._ts._dirty = (rhs->_attr)._var._ts._dirty;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&(this->_attr)._paths,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&(rhs->_attr)._paths);
  AttrMetas::operator=(&(this->_attr)._metas,&(rhs->_attr)._metas);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->_indices,&rhs->_indices);
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ::operator=(&(this->_ts_indices)._samples,&(rhs->_ts_indices)._samples);
  (this->_ts_indices)._dirty = (rhs->_ts_indices)._dirty;
  this->_has_value = rhs->_has_value;
  if ((rhs->_elementSize).has_value_ == true) {
    if ((this->_elementSize).has_value_ == false) {
      (this->_elementSize).contained = (rhs->_elementSize).contained;
      (this->_elementSize).has_value_ = true;
    }
    else {
      (this->_elementSize).contained = (rhs->_elementSize).contained;
    }
  }
  if ((rhs->_interpolation).has_value_ == true) {
    if ((this->_interpolation).has_value_ == false) {
      (this->_interpolation).contained = (rhs->_interpolation).contained;
      (this->_interpolation).has_value_ = true;
    }
    else {
      (this->_interpolation).contained = (rhs->_interpolation).contained;
    }
  }
  bVar1 = (rhs->_unauthoredValuesIndex).has_value_;
  if ((this->_unauthoredValuesIndex).has_value_ == true) {
    if (bVar1 == false) {
      (this->_unauthoredValuesIndex).has_value_ = false;
    }
    else {
      (this->_unauthoredValuesIndex).contained = (rhs->_unauthoredValuesIndex).contained;
    }
  }
  else if (bVar1 != false) {
    (this->_unauthoredValuesIndex).contained = (rhs->_unauthoredValuesIndex).contained;
    (this->_unauthoredValuesIndex).has_value_ = true;
  }
  return this;
}

Assistant:

GeomPrimvar &operator=(const GeomPrimvar &rhs) {
    _name = rhs._name;
    _attr = rhs._attr;
    _indices = rhs._indices;
    _ts_indices = rhs._ts_indices;
    _has_value = rhs._has_value;
    if (rhs._elementSize) {
      _elementSize = rhs._elementSize;
    }

    if (rhs._interpolation) {
      _interpolation = rhs._interpolation;
    }
    _unauthoredValuesIndex = rhs._unauthoredValuesIndex;

    return *this;
  }